

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledSetSuperPropertyStrict<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  Var value;
  Var value_00;
  
  value = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  value_00 = *(Var *)(this + (ulong)playout->Value2 * 8 + 0x160);
  ValidateRegValue(this,value_00,false,true);
  ProfiledSetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned,false>
            (this,playout,value,value_00,PropertyOperation_StrictMode);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledSetSuperPropertyStrict(unaligned T* playout)
    {
        ProfiledSetSuperProperty<T, false>(playout, GetReg(playout->Instance), GetReg(playout->Value2), PropertyOperation_StrictMode);
    }